

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddBezierCubic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,ImU32 col,float thickness,
          int num_segments)

{
  float thickness_local;
  ImU32 col_local;
  ImVec2 *p4_local;
  ImVec2 *p3_local;
  ImVec2 *p2_local;
  ImVec2 *p1_local;
  ImDrawList *this_local;
  
  if ((col & 0xff000000) != 0) {
    PathLineTo(this,p1);
    PathBezierCubicCurveTo(this,p2,p3,p4,num_segments);
    PathStroke(this,col,false,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCubic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierCubicCurveTo(p2, p3, p4, num_segments);
    PathStroke(col, false, thickness);
}